

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O0

int MRIStepSetNonlinear(void *arkode_mem)

{
  int retval;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  void *in_stack_ffffffffffffffe8;
  int local_4;
  
  local_4 = mriStep_AccessStepMem
                      (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                       (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       (ARKodeMRIStepMem *)0x1183354);
  if (local_4 == 0) {
    in_stack_ffffffffffffffe0[0x10] = '\0';
    in_stack_ffffffffffffffe0[0x11] = '\0';
    in_stack_ffffffffffffffe0[0x12] = '\0';
    in_stack_ffffffffffffffe0[0x13] = '\0';
    in_stack_ffffffffffffffe0[0x14] = '\x01';
    in_stack_ffffffffffffffe0[0x15] = '\0';
    in_stack_ffffffffffffffe0[0x16] = '\0';
    in_stack_ffffffffffffffe0[0x17] = '\0';
    in_stack_ffffffffffffffe0[0xc0] = -0x66;
    in_stack_ffffffffffffffe0[0xc1] = -0x67;
    in_stack_ffffffffffffffe0[0xc2] = -0x67;
    in_stack_ffffffffffffffe0[0xc3] = -0x67;
    in_stack_ffffffffffffffe0[0xc4] = -0x67;
    in_stack_ffffffffffffffe0[0xc5] = -0x67;
    in_stack_ffffffffffffffe0[0xc6] = -0x37;
    in_stack_ffffffffffffffe0[199] = '?';
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int MRIStepSetNonlinear(void *arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "MRIStepSetNonlinear",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* set parameters */
  step_mem->linear = SUNFALSE;
  step_mem->linear_timedep = SUNTRUE;
  step_mem->dgmax = DGMAX;

  return(ARK_SUCCESS);
}